

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

node_t unary_expression(void)

{
  int iVar1;
  node_t pvVar2;
  char *pcVar3;
  socklen_t *in_RDX;
  sockaddr *in_RSI;
  
  if (t->id == 0x87) {
    pvVar2 = constant(t->constant);
  }
  else {
    if (t->id != 0x86) {
      iVar1 = accept(0x28,in_RSI,in_RDX);
      if (iVar1 != 0) {
        pvVar2 = assignment_expression();
        if (pvVar2 == (node_t)0x0) {
          pcVar3 = token_name(last_id);
          err(E,"expected expression after %s",pcVar3);
        }
        else {
          iVar1 = expect(0x29);
          if (iVar1 != 0) {
            return pvVar2;
          }
        }
        sync();
      }
      goto LAB_0010584f;
    }
    pvVar2 = identifier(t->string);
  }
  next();
  if (pvVar2 != (node_t)0x0) {
    return pvVar2;
  }
LAB_0010584f:
  iVar1 = t->id;
  if ((iVar1 - 0x2bU & 0xfffffffd) == 0) {
    next();
    pvVar2 = unary_expression();
    if (pvVar2 != (node_t)0x0) {
      pvVar2 = unop(iVar1,pvVar2);
      return pvVar2;
    }
    pcVar3 = token_name(iVar1);
    err(E,"expected expression after %s",pcVar3);
  }
  return (node_t)0x0;
}

Assistant:

node_t unary_expression()
{
    node_t n = NULL;
    if ((n = postfix_expression()))
    {
        return n;
    }
    else if (unary_operator())
    {
        int op = t->id;
        node_t right = NULL;
        next();
        if (!(right = cast_expression()))
        {
            err(E, "expected expression after %s", token_name(op));
            return NULL;
        }

        n = unop(op, right);

        return n;
    }

    return NULL;
}